

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall soul::heart::Parser::checkVersionDeclaration(Parser *this)

{
  bool bVar1;
  int64_t iVar2;
  CodeLocation errorContext;
  CodeLocation local_c0;
  CompileMessage local_b0;
  CompileMessage local_78;
  CompileMessage local_40;
  
  local_c0.sourceCode.object =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.sourceCode.object;
  if (local_c0.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_c0.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_c0.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_c0.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x2c924a);
  Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>::
  expect<char_const*>((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                       *)this,"SOUL");
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,(TokenType)0x2a3459);
  if (!bVar1) {
    Errors::expectedVersionNumber<>();
    CodeLocation::throwError(&local_c0,&local_40);
  }
  CodeLocation::operator=
            (&local_c0,
             &(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).location);
  iVar2 = parseLiteralInt(this);
  if (iVar2 < 1) {
    Errors::expectedVersionNumber<>();
    CodeLocation::throwError(&local_c0,&local_78);
  }
  if (iVar2 == 1) {
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_c0.sourceCode);
    return;
  }
  Errors::wrongAPIVersion<>();
  CodeLocation::throwError(&local_c0,&local_b0);
}

Assistant:

void checkVersionDeclaration()
    {
        auto errorContext = location;
        expect (HEARTOperator::hash);
        expect (getHEARTFormatVersionPrefix());

        if (! matches (Token::literalInt32))
            errorContext.throwError (Errors::expectedVersionNumber());

        errorContext = location;
        auto version = parseLiteralInt();

        if (version <= 0)
            errorContext.throwError (Errors::expectedVersionNumber());

        if (version > getHEARTFormatVersion())
            errorContext.throwError (Errors::wrongAPIVersion());
    }